

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

void __thiscall
nestl::impl::vector<int,_nestl::test::minimal_allocator<int>_>::
grow<nestl::has_exceptions::exception_ptr_error>
          (vector<int,_nestl::test::minimal_allocator<int>_> *this,exception_ptr_error *err,
          size_type requiredCapacity)

{
  size_type sVar1;
  ulong local_28;
  size_t newCapacity;
  size_type requiredCapacity_local;
  exception_ptr_error *err_local;
  vector<int,_nestl::test::minimal_allocator<int>_> *this_local;
  
  sVar1 = capacity(this);
  local_28 = (sVar1 + 1) * 3 >> 1;
  if (local_28 < requiredCapacity) {
    local_28 = requiredCapacity;
  }
  sVar1 = capacity(this);
  if (sVar1 < local_28) {
    reserve_nothrow<nestl::has_exceptions::exception_ptr_error>(this,err,local_28);
    return;
  }
  __assert_fail("newCapacity > capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/prograholic[P]nestl/nestl/implementation/vector.hpp"
                ,0x328,
                "void nestl::impl::vector<int, nestl::test::minimal_allocator<int>>::grow(OperationError &, size_type) [T = int, Allocator = nestl::test::minimal_allocator<int>, OperationError = nestl::has_exceptions::exception_ptr_error]"
               );
}

Assistant:

void
vector<T, A>::grow(OperationError& err, size_type requiredCapacity) NESTL_NOEXCEPT_SPEC
{
    size_t newCapacity = (((capacity() + 1) * 3) / 2);
    if (newCapacity < requiredCapacity)
    {
        newCapacity = requiredCapacity;
    }

    /// @bug overflow error
    assert(newCapacity > capacity());

    reserve_nothrow(err, newCapacity);
}